

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testInvalidQueryName(ErrorsTest *this)

{
  ostringstream *poVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  GLuint GVar14;
  GLuint buffer;
  GLuint query;
  GLuint local_1c8;
  GLuint local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar13;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar3);
  GVar14 = 0;
  do {
    GVar14 = GVar14 + 1;
    cVar2 = (**(code **)(lVar13 + 0xca0))(GVar14);
  } while (cVar2 != '\0');
  local_1c8 = 0;
  local_1c4 = 0;
  (**(code **)(lVar13 + 0x6c8))(1);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x23c);
  (**(code **)(lVar13 + 0x40))(0x8c8e,local_1c8);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x23f);
  (**(code **)(lVar13 + 0x150))(0x8c8e,8,0,0x88ea);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x242);
  (*this->m_pGetQueryBufferObjectiv)(GVar14,local_1c8,0x8866,0);
  iVar3 = (**(code **)(lVar13 + 0x800))();
  if (iVar3 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectiv called with invalid query name has generated error ",0x4c);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjectuiv)(GVar14,local_1c8,0x8866,0);
  iVar5 = (**(code **)(lVar13 + 0x800))();
  if (iVar5 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectuiv called with invalid query name has generated error ",0x4d)
    ;
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjecti64v)(GVar14,local_1c8,0x8866,0);
  iVar6 = (**(code **)(lVar13 + 0x800))();
  if (iVar6 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjecti64v called with invalid query name has generated error ",0x4e
              );
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjectui64v)(GVar14,local_1c8,0x8866,0);
  iVar7 = (**(code **)(lVar13 + 0x800))();
  if (iVar7 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectui64v called with invalid query name has generated error ",
               0x4f);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar7;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar13 + 0x3d8))(0x8914,1,&local_1c4);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x286);
  (**(code **)(lVar13 + 0x20))(0x8914,local_1c4);
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x289);
  (*this->m_pGetQueryBufferObjectiv)(local_1c4,local_1c8,0x8866,0);
  iVar8 = (**(code **)(lVar13 + 0x800))();
  if (iVar8 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectiv called with active query object has generated error ",0x4d)
    ;
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar8;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjectuiv)(local_1c4,local_1c8,0x8866,0);
  iVar9 = (**(code **)(lVar13 + 0x800))();
  if (iVar9 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectuiv called with active query object has generated error ",0x4e
              );
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar9;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjecti64v)(local_1c4,local_1c8,0x8866,0);
  iVar10 = (**(code **)(lVar13 + 0x800))();
  if (iVar10 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjecti64v called with active query object has generated error ",
               0x4f);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar10;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  (*this->m_pGetQueryBufferObjectui64v)(local_1c4,local_1c8,0x8866,0);
  iVar11 = (**(code **)(lVar13 + 0x800))();
  if (iVar11 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetQueryBufferObjectui64v called with active query object has generated error ",
               0x50);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar11;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", however GL_INVALID_OPERATION was expected.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  if (local_1c4 != 0) {
    (**(code **)(lVar13 + 0x628))(0x8914);
    (**(code **)(lVar13 + 0x458))(1,&local_1c4);
  }
  if (local_1c8 != 0) {
    (**(code **)(lVar13 + 0x438))(1,&local_1c8);
  }
  do {
    iVar12 = (**(code **)(lVar13 + 0x800))();
  } while (iVar12 != 0);
  return iVar11 == 0x502 &&
         (iVar10 == 0x502 &&
         (iVar9 == 0x502 &&
         (iVar8 == 0x502 &&
         (iVar7 == 0x502 && (iVar6 == 0x502 && (iVar5 == 0x502 && iVar3 == 0x502))))));
}

Assistant:

bool ErrorsTest::testInvalidQueryName()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating invalid query name. */
	glw::GLuint invalid_query = 0;

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	while (gl.isQuery(++invalid_query))
		;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Test invalid query object name (integer version). */
		m_pGetQueryBufferObjectiv(invalid_query, buffer, GL_QUERY_RESULT, 0);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		gl.beginQuery(s_targets[0], query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query of active query object name (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.endQuery(s_targets[0]);

		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}